

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

void rtp_pkt_pack(rtp_pkt_t *pkt)

{
  uchar *ptr_1;
  uchar *ptr;
  rtp_pkt_t *pkt_local;
  
  if (pkt == (rtp_pkt_t *)0x0) {
    __assert_fail("pkt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",0x55,
                  "void rtp_pkt_pack(rtp_pkt_t *)");
  }
  pkt->data[0] = (uchar)(((uint)pkt->b & 3) << 6);
  pkt->data[0] = pkt->data[0] | (byte)(((uint)pkt->b >> 2 & 1) << 5);
  pkt->data[0] = pkt->data[0] | (byte)(((uint)pkt->b >> 3 & 1) << 4);
  pkt->data[0] = pkt->data[0] | (byte)((uint)pkt->b >> 4) & 0xf;
  pkt->data[1] = (uchar)(((uint)pkt->b >> 8 & 1) << 7);
  pkt->data[1] = pkt->data[1] | (byte)((uint)pkt->b >> 9) & 0x7f;
  pkt->data[2] = SUB41(pkt->b,3);
  pkt->data[3] = SUB41(pkt->b,2);
  pkt->data[4] = (uchar)(pkt->timestamp >> 0x18);
  pkt->data[5] = (uchar)(pkt->timestamp >> 0x10);
  pkt->data[6] = (uchar)(pkt->timestamp >> 8);
  pkt->data[7] = (uchar)pkt->timestamp;
  pkt->data[8] = (uchar)(pkt->ssrc >> 0x18);
  pkt->data[9] = (uchar)(pkt->ssrc >> 0x10);
  pkt->data[10] = (uchar)(pkt->ssrc >> 8);
  pkt->data[0xb] = (uchar)pkt->ssrc;
  if (pkt->pack != (_func_void_rtp_pkt_s_ptr *)0x0) {
    (*pkt->pack)(pkt);
  }
  if (((uint)pkt->b >> 2 & 1) != 0) {
    if (0x5db < pkt->length + (ulong)pkt->hlen + (long)(int)(((uint)pkt->b >> 4 & 0xf) << 2) +
                (ulong)pkt->plen + 1) {
      __assert_fail("(pkt->length + pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE + pkt->plen + 1) < RTP_PKT_SIZE"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",0x71,
                    "void rtp_pkt_pack(rtp_pkt_t *)");
    }
    pkt->data[(long)(int)(uint)pkt->plen + pkt->length + (ulong)pkt->hlen] = pkt->plen;
  }
  return;
}

Assistant:

void rtp_pkt_pack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);
  
  /* v: 2 bits, p: 1 bit, x: 1 bit, cc: 4 bits */
  pkt->data[0] =  (pkt->b.v  & 0x3) << 6;
  pkt->data[0] |= (pkt->b.p  & 0x1) << 5;
  pkt->data[0] |= (pkt->b.x  & 0x1) << 4;
  pkt->data[0] |= (pkt->b.cc & 0xf);
  /* m: 1 bit, pt: 7 bits */
  pkt->data[1] =  (pkt->b.m & 0x1) << 7;
  pkt->data[1] |= (pkt->b.pt & 0x7f);

  unsigned char *ptr = pkt->data + 2;
  /* seq: 16 bits */
  UINT16_PACK(ptr, pkt->b.seq);
  /* timestamp: 32 bits */
  UINT32_PACK(ptr, pkt->timestamp);
  /* ssrc: 32 bits */
  UINT32_PACK(ptr, pkt->ssrc);

  if (pkt->pack)
    pkt->pack(pkt);

  /*M
    If we use padding, add padding length at the end of the payload.
  **/
  if (pkt->b.p) {
    assert((pkt->length +
            pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE +
            pkt->plen + 1) < RTP_PKT_SIZE);
    
    unsigned char *ptr = pkt->data + pkt->hlen + pkt->length + pkt->plen;
    *ptr = pkt->plen;
  }
}